

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O0

int lsend(lua_State *L)

{
  lua_Integer lVar1;
  char *buffer;
  char *msg;
  size_t sStack_18;
  int fd;
  size_t sz;
  lua_State *L_local;
  
  sStack_18 = 0;
  sz = (size_t)L;
  lVar1 = luaL_checkinteger(L,1);
  buffer = luaL_checklstring((lua_State *)sz,2,&stack0xffffffffffffffe8);
  block_send((lua_State *)sz,(int)lVar1,buffer,(int)sStack_18);
  return 0;
}

Assistant:

static int
lsend(lua_State *L) {
	struct skynet_context * ctx = lua_touserdata(L, lua_upvalueindex(1));
	int id = luaL_checkinteger(L, 1);
	int sz = 0;
	void *buffer = get_buffer(L, 2, &sz);
	int err = skynet_socket_send(ctx, id, buffer, sz);
	lua_pushboolean(L, !err);
	return 1;
}